

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int ffinit(fitsfile **fptr,char *name,int *status)

{
  char cVar1;
  _func_int_char_ptr *p_Var2;
  _func_int_char_ptr **pp_Var3;
  int *piVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  fitsfile *fptr_00;
  FITSfile *pFVar9;
  LONGLONG *pLVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  char *pcVar14;
  _func_int_char_ptr **pp_Var15;
  fitsfile **ppfVar16;
  int iVar17;
  int iVar18;
  int handle;
  char urltype [20];
  char compspec [80];
  char tmplfile [1025];
  char outfile [1025];
  int local_8dc;
  fitsfile **local_8d8;
  uint local_8cc;
  char *local_8c8;
  int *local_8c0;
  char local_8b8 [32];
  char local_898 [80];
  char local_848 [1040];
  char local_438 [1032];
  
  *fptr = (fitsfile *)0x0;
  iVar6 = *status;
  if (0 < iVar6) {
    return iVar6;
  }
  if (iVar6 == -0x6a) {
    *status = 0;
  }
  uVar12 = (uint)(iVar6 == -0x6a);
  if (need_to_initialize != 0) {
    iVar5 = fits_init_cfitsio();
    *status = iVar5;
    if (0 < iVar5) {
      return iVar5;
    }
  }
  for (; cVar1 = *name, cVar1 == ' '; name = name + 1) {
  }
  if (cVar1 == '\0') {
    name = "Name of file to create is blank. (ffinit)";
  }
  else {
    if (iVar6 != -0x6a) {
      name = name + (long)(ulong)(cVar1 == '!');
      ffourl(name,local_8b8,local_438,local_848,local_898,status);
      ppfVar16 = fptr;
      pcVar14 = (char *)(ulong)(cVar1 == '!');
      piVar4 = status;
      if (*status < 1) goto LAB_0011560c;
      pcVar14 = "could not parse the output filename: (ffinit)";
LAB_001156c6:
      ffpmsg(pcVar14);
      ffpmsg(name);
LAB_001156d3:
      return *status;
    }
    sVar8 = strlen(name);
    if (sVar8 < 0x401) {
      local_8d8 = fptr;
      local_8cc = uVar12;
      local_8c0 = status;
      strcpy(local_438,name);
      builtin_strncpy(local_8b8,"file://",8);
      local_848[0] = '\0';
      local_8c8 = (char *)0x0;
      local_898[0] = '\0';
      ppfVar16 = local_8d8;
      uVar12 = local_8cc;
      pcVar14 = local_8c8;
      piVar4 = local_8c0;
LAB_0011560c:
      local_8c0 = piVar4;
      local_8c8 = pcVar14;
      local_8cc = uVar12;
      local_8d8 = ppfVar16;
      uVar13 = (ulong)(uint)no_of_drivers;
      pcVar14 = ffbfwt::zeros + uVar13 * 0x98 + 0xab8;
      pp_Var3 = &driverTable[(long)(no_of_drivers + -1) + 1].remove;
      do {
        pp_Var15 = pp_Var3;
        if ((int)uVar13 < 1) {
          *local_8c0 = 0x7c;
          pcVar14 = "could not find driver for this file: (ffinit)";
          status = local_8c0;
          goto LAB_001156c6;
        }
        iVar6 = strcmp(pcVar14,local_8b8);
        status = local_8c0;
        uVar12 = (int)uVar13 - 1;
        uVar13 = (ulong)uVar12;
        pcVar14 = pcVar14 + -0x98;
        pp_Var3 = pp_Var15 + -0x13;
      } while (iVar6 != 0);
      *local_8c0 = 0;
      if (((int)local_8c8 != 0) && (p_Var2 = pp_Var15[-0x13], p_Var2 != (_func_int_char_ptr *)0x0))
      {
        (*p_Var2)(local_438);
      }
      if (pp_Var15[-0x16] != (code *)0x0) {
        iVar6 = (*pp_Var15[-0x16])(local_438,&local_8dc);
        *status = iVar6;
        if (iVar6 == 0) {
          fptr_00 = (fitsfile *)calloc(1,0x10);
          *local_8d8 = fptr_00;
          if (fptr_00 == (fitsfile *)0x0) {
            (*pp_Var15[-0x14])(local_8dc);
            ffpmsg("failed to allocate structure for following file: (ffopen)");
            ffpmsg(name);
          }
          else {
            pFVar9 = (FITSfile *)calloc(1,0x7e8);
            fptr_00->Fptr = pFVar9;
            if (pFVar9 == (FITSfile *)0x0) {
              (*pp_Var15[-0x14])(local_8dc);
              ffpmsg("failed to allocate structure for following file: (ffopen)");
              ffpmsg(name);
              ppfVar16 = local_8d8;
            }
            else {
              sVar8 = strlen(name);
              uVar7 = (int)sVar8 + 1;
              sVar8 = 0x20;
              if (0x20 < (int)uVar7) {
                sVar8 = (size_t)uVar7;
              }
              pcVar14 = (char *)malloc(sVar8);
              pFVar9->filename = pcVar14;
              if (pcVar14 == (char *)0x0) {
                (*pp_Var15[-0x14])(local_8dc);
                ffpmsg("failed to allocate memory for filename: (ffinit)");
                ffpmsg(name);
                ppfVar16 = local_8d8;
                free((*local_8d8)->Fptr);
                free(*ppfVar16);
                *ppfVar16 = (fitsfile *)0x0;
                goto LAB_00115545;
              }
              local_8c8 = pcVar14;
              pLVar10 = (LONGLONG *)calloc(0x3e9,8);
              pFVar9->headstart = pLVar10;
              if (pLVar10 == (LONGLONG *)0x0) {
                (*pp_Var15[-0x14])(local_8dc);
                ffpmsg("failed to allocate memory for headstart array: (ffinit)");
                ffpmsg(name);
                ppfVar16 = local_8d8;
              }
              else {
                pcVar14 = (char *)calloc(0x28,0xb40);
                pFVar9->iobuffer = pcVar14;
                if (pcVar14 != (char *)0x0) {
                  memset(pFVar9->bufrecnum,0xff,0x140);
                  iVar6 = 0;
                  iVar5 = 1;
                  iVar17 = 2;
                  iVar18 = 3;
                  lVar11 = 0x1d2;
                  do {
                    piVar4 = &pFVar9->filehandle + lVar11;
                    *piVar4 = iVar6;
                    piVar4[1] = iVar5;
                    piVar4[2] = iVar17;
                    piVar4[3] = iVar18;
                    iVar6 = iVar6 + 4;
                    iVar5 = iVar5 + 4;
                    iVar17 = iVar17 + 4;
                    iVar18 = iVar18 + 4;
                    lVar11 = lVar11 + 4;
                  } while (lVar11 != 0x1fa);
                  pFVar9->MAXHDU = 1000;
                  pFVar9->filehandle = local_8dc;
                  pFVar9->driver = uVar12;
                  strcpy(local_8c8,name);
                  pFVar9->filesize = 0;
                  pFVar9->logfilesize = 0;
                  pFVar9->writemode = 1;
                  pFVar9->datastart = -1;
                  pFVar9->curbuf = -1;
                  pFVar9->open_count = 1;
                  pFVar9->validcode = 0x22b;
                  pFVar9->noextsyntax = local_8cc;
                  ffldrc(fptr_00,0,1,status);
                  ppfVar16 = local_8d8;
                  if (*status < 1) {
                    lVar11 = 0;
                    do {
                      if (*(long *)((long)FptrTable + lVar11) == 0) {
                        *(FITSfile **)((long)FptrTable + lVar11) = (*local_8d8)->Fptr;
                        break;
                      }
                      lVar11 = lVar11 + 8;
                    } while (lVar11 != 80000);
                  }
                  if (local_848[0] != '\0') {
                    ffoptplt(*local_8d8,local_848,status);
                  }
                  if (local_898[0] != '\0') {
                    ffparsecompspec(*ppfVar16,local_898,status);
                  }
                  goto LAB_001156d3;
                }
                (*pp_Var15[-0x14])(local_8dc);
                ffpmsg("failed to allocate memory for iobuffer array: (ffinit)");
                ffpmsg(name);
                ppfVar16 = local_8d8;
                free((*local_8d8)->Fptr->headstart);
              }
              free((*ppfVar16)->Fptr->filename);
              free((*ppfVar16)->Fptr);
            }
            free(*ppfVar16);
            *ppfVar16 = (fitsfile *)0x0;
          }
          *status = 0x71;
          return 0x71;
        }
        pcVar14 = "failed to create new file (already exists?):";
        goto LAB_001156c6;
      }
      ffpmsg("cannot create a new file of this type: (ffinit)");
    }
    else {
      name = "Filename is too long. (ffinit)";
    }
  }
  ffpmsg(name);
LAB_00115545:
  *status = 0x69;
  return 0x69;
}

Assistant:

int ffinit(fitsfile **fptr,      /* O - FITS file pointer                   */
           const char *name,     /* I - name of file to create              */
           int *status)          /* IO - error status                       */
/*
  Create and initialize a new FITS file.
*/
{
    int ii, driver, slen, clobber = 0;
    char *url;
    char urltype[MAX_PREFIX_LEN], outfile[FLEN_FILENAME];
    char tmplfile[FLEN_FILENAME], compspec[80];
    int handle, create_disk_file = 0;

    *fptr = 0;              /* initialize null file pointer, */
                            /* regardless of the value of *status */
    if (*status > 0)
        return(*status);

    if (*status == CREATE_DISK_FILE)
    {
       create_disk_file = 1;
       *status = 0;
    }

    if (need_to_initialize)  {          /* this is called only once */
        *status = fits_init_cfitsio();
    }

    if (*status > 0)
        return(*status);

    url = (char *) name;
    while (*url == ' ')  /* ignore leading spaces in the filename */
        url++;

    if (*url == '\0')
    {
        ffpmsg("Name of file to create is blank. (ffinit)");
        return(*status = FILE_NOT_CREATED);
    }

    if (create_disk_file)
    {
       if (strlen(url) > FLEN_FILENAME - 1)
       {
           ffpmsg("Filename is too long. (ffinit)");
           return(*status = FILE_NOT_CREATED);
       }

       strcpy(outfile, url);
       strcpy(urltype, "file://");
       tmplfile[0] = '\0';
       compspec[0] = '\0';
    }
    else
    {
       
      /* check for clobber symbol, i.e,  overwrite existing file */
      if (*url == '!')
      {
          clobber = TRUE;
          url++;
      }
      else
          clobber = FALSE;

        /* parse the output file specification */
	/* this routine checks that the strings will not overflow */
      ffourl(url, urltype, outfile, tmplfile, compspec, status);

      if (*status > 0)
      {
        ffpmsg("could not parse the output filename: (ffinit)");
        ffpmsg(url);
        return(*status);
      }
    }
    
        /* find which driver corresponds to the urltype */
    *status = urltype2driver(urltype, &driver);

    if (*status)
    {
        ffpmsg("could not find driver for this file: (ffinit)");
        ffpmsg(url);
        return(*status);
    }

        /* delete pre-existing file, if asked to do so */
    if (clobber)
    {
        if (driverTable[driver].remove)
             (*driverTable[driver].remove)(outfile);
    }

        /* call appropriate driver to create the file */
    if (driverTable[driver].create)
    {

        FFLOCK;  /* lock this while searching for vacant handle */
        *status = (*driverTable[driver].create)(outfile, &handle);
        FFUNLOCK;

        if (*status)
        {
            ffpmsg("failed to create new file (already exists?):");
            ffpmsg(url);
            return(*status);
       }
    }
    else
    {
        ffpmsg("cannot create a new file of this type: (ffinit)");
        ffpmsg(url);
        return(*status = FILE_NOT_CREATED);
    }

        /* allocate fitsfile structure and initialize = 0 */
    *fptr = (fitsfile *) calloc(1, sizeof(fitsfile));

    if (!(*fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffopen)");
        ffpmsg(url);
        return(*status = MEMORY_ALLOCATION);
    }

        /* allocate FITSfile structure and initialize = 0 */
    (*fptr)->Fptr = (FITSfile *) calloc(1, sizeof(FITSfile));

    if (!((*fptr)->Fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffopen)");
        ffpmsg(url);
        free(*fptr);
        *fptr = 0;       
        return(*status = MEMORY_ALLOCATION);
    }

    slen = strlen(url) + 1;
    slen = maxvalue(slen, 32); /* reserve at least 32 chars */ 
    ((*fptr)->Fptr)->filename = (char *) malloc(slen); /* mem for file name */

    if ( !(((*fptr)->Fptr)->filename) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for filename: (ffinit)");
        ffpmsg(url);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = FILE_NOT_CREATED);
    }

    /* mem for headstart array */
    ((*fptr)->Fptr)->headstart = (LONGLONG *) calloc(1001, sizeof(LONGLONG)); 

    if ( !(((*fptr)->Fptr)->headstart) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for headstart array: (ffinit)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for file I/O buffers */
    ((*fptr)->Fptr)->iobuffer = (char *) calloc(NIOBUF, IOBUFLEN);

    if ( !(((*fptr)->Fptr)->iobuffer) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for iobuffer array: (ffinit)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->headstart);    /* free memory for headstart array */
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* initialize the ageindex array (relative age of the I/O buffers) */
    /* and initialize the bufrecnum array as being empty */
    for (ii = 0; ii < NIOBUF; ii++)  {
        ((*fptr)->Fptr)->ageindex[ii] = ii;
        ((*fptr)->Fptr)->bufrecnum[ii] = -1;
    }

        /* store the parameters describing the file */
    ((*fptr)->Fptr)->MAXHDU = 1000;              /* initial size of headstart */
    ((*fptr)->Fptr)->filehandle = handle;        /* store the file pointer */
    ((*fptr)->Fptr)->driver = driver;            /*  driver number         */
    strcpy(((*fptr)->Fptr)->filename, url);      /* full input filename    */
    ((*fptr)->Fptr)->filesize = 0;               /* physical file size     */
    ((*fptr)->Fptr)->logfilesize = 0;            /* logical file size      */
    ((*fptr)->Fptr)->writemode = 1;              /* read-write mode        */
    ((*fptr)->Fptr)->datastart = DATA_UNDEFINED; /* unknown start of data  */
    ((*fptr)->Fptr)->curbuf = -1;         /* undefined current IO buffer   */
    ((*fptr)->Fptr)->open_count = 1;      /* structure is currently used once */
    ((*fptr)->Fptr)->validcode = VALIDSTRUC; /* flag denoting valid structure */
    ((*fptr)->Fptr)->noextsyntax = create_disk_file; /* true if extended syntax is disabled */

    ffldrc(*fptr, 0, IGNORE_EOF, status);     /* initialize first record */

    fits_store_Fptr( (*fptr)->Fptr, status);  /* store Fptr address */

    /* if template file was given, use it to define structure of new file */

    if (tmplfile[0])
        ffoptplt(*fptr, tmplfile, status);

    /* parse and save image compression specification, if given */
    if (compspec[0])
        ffparsecompspec(*fptr, compspec, status);

    return(*status);                       /* successful return */
}